

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

bool __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<1>::erase_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  difference_type __d;
  long lVar14;
  bool bVar15;
  
  uVar7 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = (uVar7 & 0xffff) >> 10;
  uVar4 = (this->occupation).occupation;
  if ((uVar4 >> uVar2 & 1) == 0) {
    return false;
  }
  iVar3 = (int)POPCOUNT(uVar4 >> (sbyte)uVar2);
  uVar12 = (ulong)(uint)(iVar3 * 8);
  iVar3 = 3 - iVar3;
  lVar8 = uVar12 * -3;
  do {
    uVar13 = uVar12;
    iVar3 = iVar3 + -1;
    lVar8 = lVar8 + -0x18;
    uVar12 = uVar13 + 8;
  } while ((ushort)uVar2 < *(ushort *)((long)(this->hashes)._M_elems + (uVar13 - 8)) >> 10);
  uVar7 = uVar7 & 0xffff;
  iVar5 = -iVar3;
  do {
    uVar9 = uVar12;
    lVar8 = lVar8 + -0x18;
    iVar5 = iVar5 + 1;
    uVar12 = uVar9 + 8;
  } while (uVar7 < *(ulong *)((long)(this->hashes)._M_elems + (uVar9 - 0x10)));
  iVar1 = this->size;
  if ((iVar1 == iVar5) || (*(ulong *)((long)(this->hashes)._M_elems + (uVar9 - 0x10)) != uVar7)) {
    bVar15 = false;
  }
  else {
    piVar11 = (int *)((long)this - lVar8);
    puVar10 = (ulong *)((long)(this->hashes)._M_elems + (uVar9 - 8));
    iVar6 = iVar5;
    do {
      bVar15 = *key == *piVar11;
      iVar5 = iVar6;
      if ((bVar15) || (iVar5 = iVar1, iVar6 - iVar1 == -1)) break;
      iVar5 = iVar6 + 1;
      piVar11 = piVar11 + 6;
      uVar12 = *puVar10;
      puVar10 = puVar10 + 1;
      iVar6 = iVar5;
    } while (uVar12 == uVar7);
  }
  if (bVar15 == false) {
    return false;
  }
  this->size = iVar1 + -1;
  if (iVar5 < iVar1 + -1) {
    lVar14 = (long)(iVar5 + 1);
    lVar8 = (long)iVar5;
    if (iVar1 != iVar5 + 1) {
      memmove((this->entries)._M_elems + lVar8,(this->entries)._M_elems + lVar14,
              (iVar1 - lVar14) * 0x18);
    }
    memmove((this->hashes)._M_elems + lVar8,(this->hashes)._M_elems + lVar14,
            (this->size - lVar8) * 8);
    if (*(ushort *)((long)(this->hashes)._M_elems + (uVar13 - 8)) >> 10 == (ushort)uVar2)
    goto LAB_002ad48d;
    uVar4 = (this->occupation).occupation;
  }
  else if (iVar5 + iVar3 != 1) goto LAB_002ad48d;
  (this->occupation).occupation = uVar4 ^ 1L << (sbyte)uVar2;
LAB_002ad48d:
  (this->hashes)._M_elems[this->size] = 0;
  return bVar15;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }